

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O2

string * fs_get_username_abi_cxx11_(void)

{
  passwd *ppVar1;
  string *in_RDI;
  allocator<char> local_9;
  
  ppVar1 = fs_getpwuid();
  if (ppVar1 == (passwd *)0x0) {
    fs_print_error("","fs_get_username");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,ppVar1->pw_name,&local_9);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_username()
{
  // Get username of the current user

#if defined(_WIN32)

// https://learn.microsoft.com/en-us/windows/win32/api/secext/nf-secext-getusernameexa
  std::string name(fs_get_max_path(), '\0');
  ULONG L = static_cast<ULONG>(name.size());
// https://learn.microsoft.com/en-us/windows/win32/api/secext/ne-secext-extended_name_format
  if(GetUserNameExA(NameSamCompatible, name.data(), &L) != 0){
    name.resize(L);
    return name;
  }

#else

  if (auto pw = fs_getpwuid())
    return pw->pw_name;

#endif

  fs_print_error("", __func__);
  return {};
}